

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picker.cpp
# Opt level: O2

void __thiscall
QtMWidgets::Picker::insertItem(Picker *this,int index,QString *text,QVariant *userData)

{
  int iVar1;
  PickerPrivate *pPVar2;
  QAbstractItemModel *pQVar3;
  QVariant *pQVar4;
  bool bVar5;
  char cVar6;
  int iVar7;
  QStandardItemModel *this_00;
  QStandardItem *this_01;
  int iVar8;
  QMap<int,_QVariant> values;
  int local_74;
  anon_union_24_3_e3d07ef4_for_data local_70;
  QVariant *local_50;
  QModelIndex item;
  
  iVar7 = count(this);
  if (iVar7 < index) {
    index = iVar7;
  }
  iVar8 = 0;
  if (0 < index) {
    iVar8 = index;
  }
  pPVar2 = (this->d).d;
  if (pPVar2->maxCount <= iVar8) {
    return;
  }
  local_50 = userData;
  this_00 = qobject_cast<QStandardItemModel*>((QObject *)pPVar2->model);
  if (this_00 == (QStandardItemModel *)0x0) {
    pPVar2 = (this->d).d;
    pPVar2->inserting = true;
    pQVar3 = pPVar2->model;
    QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)&local_70,&pPVar2->root);
    cVar6 = (**(code **)(*(long *)pQVar3 + 0xf8))(pQVar3,iVar8,1,&local_70);
    if (cVar6 == '\0') {
      ((this->d).d)->inserting = false;
      goto LAB_0017dbac;
    }
    pPVar2 = (this->d).d;
    pQVar3 = pPVar2->model;
    iVar1 = pPVar2->modelColumn;
    QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)&local_70,&pPVar2->root);
    (**(code **)(*(long *)pQVar3 + 0x60))(&item,pQVar3,iVar8,iVar1,&local_70);
    pQVar4 = local_50;
    bVar5 = QVariant::isValid(local_50);
    if (bVar5) {
      values.d.d = (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
                    )(QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                      *)0x0;
      if ((text->d).ptr != (char16_t *)0x0) {
        local_74 = 0;
        QVariant::QVariant((QVariant *)&local_70,(QString *)text);
        QMap<int,_QVariant>::insert(&values,&local_74,(QVariant *)&local_70);
        QVariant::~QVariant((QVariant *)&local_70);
      }
      bVar5 = QVariant::isValid(pQVar4);
      if (bVar5) {
        local_70._0_4_ = 0x100;
        QMap<int,_QVariant>::insert(&values,(int *)local_70.data,pQVar4);
      }
      if ((values.d.d !=
           (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
            *)0x0) && (*(long *)((long)values.d.d + 0x30) != 0)) {
        pQVar3 = ((this->d).d)->model;
        (**(code **)(*(long *)pQVar3 + 0xb8))(pQVar3,&item,&values);
      }
      QtPrivate::
      QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
      ::~QExplicitlySharedDataPointerV2(&values.d);
    }
    else {
      pQVar3 = ((this->d).d)->model;
      QVariant::QVariant((QVariant *)&local_70,(QString *)text);
      (**(code **)(*(long *)pQVar3 + 0x98))(pQVar3,&item,&local_70,0);
      QVariant::~QVariant((QVariant *)&local_70);
    }
    pPVar2 = (this->d).d;
    pPVar2->inserting = false;
    QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)&local_70,&pPVar2->root);
    _q_rowsInserted(this,(QModelIndex *)&local_70,iVar8,iVar8);
  }
  else {
    this_01 = (QStandardItem *)operator_new(0x10);
    QStandardItem::QStandardItem(this_01,(QString *)text);
    pQVar4 = local_50;
    bVar5 = QVariant::isValid(local_50);
    if (bVar5) {
      (**(code **)(*(long *)this_01 + 0x20))(this_01,pQVar4,0x100);
    }
    QStandardItemModel::insertRow(this_00,iVar8,this_01);
  }
  iVar7 = iVar7 + 1;
LAB_0017dbac:
  pPVar2 = (this->d).d;
  iVar8 = iVar7 - pPVar2->maxCount;
  if (iVar8 != 0 && pPVar2->maxCount <= iVar7) {
    pQVar3 = pPVar2->model;
    QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)&local_70,&pPVar2->root);
    (**(code **)(*(long *)pQVar3 + 0x108))(pQVar3,iVar7 + -1,iVar8,&local_70);
  }
  return;
}

Assistant:

void
Picker::insertItem( int index, const QString & text, const QVariant & userData )
{
	int itemCount = count();

	index = qBound( 0, index, itemCount );

	if( index >= d->maxCount )
		return;

	// For the common case where we are using the built in QStandardItemModel
	// construct a QStandardItem, reducing the number of expensive signals from
	// the model
	if( QStandardItemModel * m = qobject_cast< QStandardItemModel* > ( d->model ) )
	{
		QStandardItem * item = new QStandardItem( text );
		if( userData.isValid() ) item->setData( userData, Qt::UserRole );
		m->insertRow( index, item );
		++itemCount;
	}
	else
	{
		d->inserting = true;

		if( d->model->insertRows( index, 1, d->root ) )
		{
			QModelIndex item = d->model->index( index, d->modelColumn, d->root );

			if( !userData.isValid() )
				d->model->setData( item, text, Qt::DisplayRole );
			else
			{
				QMap< int, QVariant > values;

				if( !text.isNull() ) values.insert( Qt::DisplayRole, text );
				if( userData.isValid() ) values.insert( Qt::UserRole, userData );
				if( !values.isEmpty() ) d->model->setItemData( item, values );
			}

			d->inserting = false;

			_q_rowsInserted( d->root, index, index );

			++itemCount;
		}
		else
			d->inserting = false;
	}

	if( itemCount > d->maxCount )
		d->model->removeRows( itemCount - 1, itemCount - d->maxCount, d->root );
}